

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuBilinearImageCompare.cpp
# Opt level: O3

RGBA __thiscall
tcu::anon_unknown_0::bilinearSampleRGBA8
          (anon_unknown_0 *this,ConstPixelBufferAccess *access,deUint32 u,deUint32 v)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  
  uVar9 = u & 0xff;
  uVar4 = v & 0xff;
  uVar3 = (v >> 8) * (int)this;
  uVar5 = (ulong)(u >> 8);
  uVar1 = *(uint *)((long)(access->m_size).m_data + uVar5 * 4 + (ulong)uVar3 + -8);
  uVar3 = *(uint *)((long)(access->m_size).m_data + uVar5 * 4 + (ulong)uVar3 + -4);
  uVar6 = ((v >> 8) + 1) * (int)this;
  uVar2 = *(uint *)((long)(access->m_size).m_data + uVar5 * 4 + (ulong)uVar6 + -8);
  uVar6 = *(uint *)((long)(access->m_size).m_data + uVar5 * 4 + (ulong)uVar6 + -4);
  iVar7 = 0x100 - uVar9;
  iVar8 = 0x100 - uVar4;
  return (RGBA)((((uVar2 >> 0x18) * uVar4 + (uVar1 >> 0x18) * iVar8) * iVar7 +
                ((uVar6 >> 0x18) * uVar4 + (uVar3 >> 0x18) * iVar8) * uVar9) * 0x100 + 0x800000 &
                0xff000000 |
                ((uVar2 >> 0x10 & 0xff) * uVar4 + (uVar1 >> 0x10 & 0xff) * iVar8) * iVar7 +
                ((uVar6 >> 0x10 & 0xff) * uVar4 + (uVar3 >> 0x10 & 0xff) * iVar8) * uVar9 + 0x8000 &
                0xff0000 |
                ((uVar2 & 0xff) * uVar4 + (uVar1 & 0xff) * iVar8) * iVar7 +
                ((uVar6 & 0xff) * uVar4 + (uVar3 & 0xff) * iVar8) * uVar9 + 0x8000 >> 0x10 & 0xff |
               ((uVar2 >> 8 & 0xff) * uVar4 + (uVar1 >> 8 & 0xff) * iVar8) * iVar7 +
               ((uVar6 >> 8 & 0xff) * uVar4 + (uVar3 >> 8 & 0xff) * iVar8) * uVar9 + 0x8000 >> 8 &
               0xff00);
}

Assistant:

RGBA bilinearSampleRGBA8 (const ConstPixelBufferAccess& access, deUint32 u, deUint32 v)
{
	deUint32	x0		= u>>NUM_SUBPIXEL_BITS;
	deUint32	y0		= v>>NUM_SUBPIXEL_BITS;
	deUint32	x1		= x0+1; //de::min(x0+1, (deUint32)(access.getWidth()-1));
	deUint32	y1		= y0+1; //de::min(y0+1, (deUint32)(access.getHeight()-1));

	DE_ASSERT(x1 < (deUint32)access.getWidth());
	DE_ASSERT(y1 < (deUint32)access.getHeight());

	deUint32	fx1		= u-(x0<<NUM_SUBPIXEL_BITS);
	deUint32	fy1		= v-(y0<<NUM_SUBPIXEL_BITS);

	deUint32	p00		= readRGBA8Raw(access, x0, y0);
	deUint32	p10		= readRGBA8Raw(access, x1, y0);
	deUint32	p01		= readRGBA8Raw(access, x0, y1);
	deUint32	p11		= readRGBA8Raw(access, x1, y1);

	deUint32	res		= 0;

	res |= interpolateChannel(fx1, fy1, getChannel<0>(p00), getChannel<0>(p01), getChannel<0>(p10), getChannel<0>(p11)) << RGBA::RED_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<1>(p00), getChannel<1>(p01), getChannel<1>(p10), getChannel<1>(p11)) << RGBA::GREEN_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<2>(p00), getChannel<2>(p01), getChannel<2>(p10), getChannel<2>(p11)) << RGBA::BLUE_SHIFT;
	res |= interpolateChannel(fx1, fy1, getChannel<3>(p00), getChannel<3>(p01), getChannel<3>(p10), getChannel<3>(p11)) << RGBA::ALPHA_SHIFT;

	return RGBA(res);
}